

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLedgerEntry.cpp
# Opt level: O0

void __thiscall
jbcoin::STLedgerEntry::STLedgerEntry(STLedgerEntry *this,STObject *object,uint256 *index)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint256 *index_local;
  STObject *object_local;
  STLedgerEntry *this_local;
  
  STObject::STObject(&this->super_STObject,object);
  CountedObject<jbcoin::STLedgerEntry>::CountedObject((CountedObject<jbcoin::STLedgerEntry> *)this);
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STLedgerEntry_00519ff8;
  uVar1 = *(undefined8 *)index->pn;
  uVar2 = *(undefined8 *)(index->pn + 2);
  uVar3 = *(undefined8 *)(index->pn + 6);
  *(undefined8 *)((this->key_).pn + 4) = *(undefined8 *)(index->pn + 4);
  *(undefined8 *)((this->key_).pn + 6) = uVar3;
  *(undefined8 *)(this->key_).pn = uVar1;
  *(undefined8 *)((this->key_).pn + 2) = uVar2;
  setSLEType(this);
  return;
}

Assistant:

STLedgerEntry::STLedgerEntry (
        STObject const& object,
        uint256 const& index)
    : STObject (object)
    , key_ (index)
{
    setSLEType ();
}